

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O0

void ncnn::conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_xop
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,Option *opt)

{
  Option *in_stack_000003b8;
  int in_stack_000003c0;
  int in_stack_000003c4;
  Mat *in_stack_000003c8;
  Mat *in_stack_000003d0;
  
  conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse
            (in_stack_000003d0,in_stack_000003c8,in_stack_000003c4,in_stack_000003c0,
             in_stack_000003b8);
  return;
}

Assistant:

void conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_xop(const Mat& kernel, Mat& kernel_tm, int inch, int outch, const Option& opt)
{
    conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse(kernel, kernel_tm, inch, outch, opt);
}